

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::ktx2_transcoder::get_image_level_info
          (ktx2_transcoder *this,ktx2_image_level_info *level_info,uint32_t level_index,
          uint32_t layer_index,uint32_t face_index)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  uint in_R8D;
  uint32_t etc1s_image_index;
  uint32_t num_blocks_y;
  uint32_t num_blocks_x;
  uint32_t level_height;
  uint32_t level_width;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar7;
  bool local_1;
  
  uVar1 = basisu::vector<basist::ktx2_level_index>::size
                    ((vector<basist::ktx2_level_index> *)(in_RDI + 0x60));
  if (in_EDX < uVar1) {
    uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<4U> *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (uVar1 < 2) {
      if (in_R8D != 0) {
        return false;
      }
    }
    else if (5 < in_R8D) {
      return false;
    }
    uVar7 = in_ECX;
    uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<4U> *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0));
    uVar2 = basisu::maximum<unsigned_int>(uVar1,1);
    if (uVar7 < uVar2) {
      uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint<4U> *)CONCAT44(uVar7,in_stack_ffffffffffffffb0));
      uVar2 = basisu::maximum<unsigned_int>(uVar1 >> ((byte)in_EDX & 0x1f),1);
      uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint<4U> *)CONCAT44(uVar7,in_stack_ffffffffffffffb0));
      uVar3 = basisu::maximum<unsigned_int>(uVar1 >> ((byte)in_EDX & 0x1f),1);
      uVar4 = uVar2 + 3 >> 2;
      uVar5 = uVar3 + 3 >> 2;
      in_RSI[2] = in_R8D;
      in_RSI[1] = in_ECX;
      *in_RSI = in_EDX;
      in_RSI[3] = uVar2;
      in_RSI[4] = uVar3;
      in_RSI[5] = uVar4 << 2;
      in_RSI[6] = uVar5 << 2;
      in_RSI[7] = uVar4;
      in_RSI[8] = uVar5;
      in_RSI[9] = uVar4 * uVar5;
      *(byte *)(in_RSI + 10) = *(byte *)(in_RDI + 0x628) & 1;
      *(undefined1 *)((long)in_RSI + 0x29) = 0;
      uVar1 = basisu::vector<basist::ktx2_etc1s_image_desc>::size
                        ((vector<basist::ktx2_etc1s_image_desc> *)(in_RDI + 0xa8));
      if (uVar1 != 0) {
        uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<4U> *)CONCAT44(uVar7,in_stack_ffffffffffffffb0));
        uVar2 = basisu::maximum<unsigned_int>(uVar1,1);
        iVar6 = in_EDX * uVar2;
        uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<4U> *)CONCAT44(uVar7,in_stack_ffffffffffffffb0));
        iVar6 = iVar6 * uVar1;
        basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)CONCAT44(uVar7,iVar6))
        ;
        basisu::vector<basist::ktx2_etc1s_image_desc>::operator[]
                  ((vector<basist::ktx2_etc1s_image_desc> *)
                   CONCAT44(in_EDX,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
        uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<4U> *)CONCAT44(uVar7,iVar6));
        *(bool *)((long)in_RSI + 0x29) = (uVar1 & 2) == 0;
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ktx2_transcoder::get_image_level_info(ktx2_image_level_info& level_info, uint32_t level_index, uint32_t layer_index, uint32_t face_index) const
	{
		if (level_index >= m_levels.size())
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: level_index >= m_levels.size()\n");
			return false;
		}

		if (m_header.m_face_count > 1)
		{
			if (face_index >= 6)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: face_index >= 6\n");
				return false;
			}
		}
		else if (face_index != 0)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: face_index != 0\n");
			return false;
		}

		if (layer_index >= basisu::maximum<uint32_t>(m_header.m_layer_count, 1))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: layer_index >= maximum<uint32_t>(m_header.m_layer_count, 1)\n");
			return false;
		}
				
		const uint32_t level_width = basisu::maximum<uint32_t>(m_header.m_pixel_width >> level_index, 1);
		const uint32_t level_height = basisu::maximum<uint32_t>(m_header.m_pixel_height >> level_index, 1);
		const uint32_t num_blocks_x = (level_width + 3) >> 2;
		const uint32_t num_blocks_y = (level_height + 3) >> 2;

		level_info.m_face_index = face_index;
		level_info.m_layer_index = layer_index;
		level_info.m_level_index = level_index;
		level_info.m_orig_width = level_width;
		level_info.m_orig_height = level_height;
		level_info.m_width = num_blocks_x * 4;
		level_info.m_height = num_blocks_y * 4;
		level_info.m_num_blocks_x = num_blocks_x;
		level_info.m_num_blocks_y = num_blocks_y;
		level_info.m_total_blocks = num_blocks_x * num_blocks_y;
		level_info.m_alpha_flag = m_has_alpha;
		level_info.m_iframe_flag = false;
		if (m_etc1s_image_descs.size())
		{
			const uint32_t etc1s_image_index =
				(level_index * basisu::maximum<uint32_t>(m_header.m_layer_count, 1) * m_header.m_face_count) +
				layer_index * m_header.m_face_count +
				face_index;

			level_info.m_iframe_flag = (m_etc1s_image_descs[etc1s_image_index].m_image_flags & KTX2_IMAGE_IS_P_FRAME) == 0;
		}

		return true;
	}